

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_string_conv * find_sconv_object(archive *a,char *fc,char *tc)

{
  int iVar1;
  archive *local_30;
  archive_string_conv *sc;
  char *tc_local;
  char *fc_local;
  archive *a_local;
  
  if (a == (archive *)0x0) {
    a_local = (archive *)0x0;
  }
  else {
    local_30 = (archive *)a->sconv;
    while ((local_30 != (archive *)0x0 &&
           ((iVar1 = strcmp((char *)local_30->vtable,fc), iVar1 != 0 ||
            (iVar1 = strcmp(*(char **)&local_30->archive_format,tc), iVar1 != 0))))) {
      local_30 = *(archive **)local_30;
    }
    a_local = local_30;
  }
  return (archive_string_conv *)a_local;
}

Assistant:

static struct archive_string_conv *
find_sconv_object(struct archive *a, const char *fc, const char *tc)
{
	struct archive_string_conv *sc; 

	if (a == NULL)
		return (NULL);

	for (sc = a->sconv; sc != NULL; sc = sc->next) {
		if (strcmp(sc->from_charset, fc) == 0 &&
		    strcmp(sc->to_charset, tc) == 0)
			break;
	}
	return (sc);
}